

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O1

string * __thiscall
bloaty::RangeMap::DebugString_abi_cxx11_(string *__return_storage_ptr__,RangeMap *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> it;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  it._M_node = (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mappings_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)it._M_node != p_Var1) {
    do {
      EntryDebugString<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                (&local_b0,this,it);
      local_60.piece_._M_len = local_b0._M_string_length;
      local_60.piece_._M_str = local_b0._M_dataplus._M_p;
      local_90.piece_._M_len = 1;
      local_90.piece_._M_str = "\n";
      absl::StrAppend(__return_storage_ptr__,&local_60,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node);
    } while ((_Rb_tree_header *)it._M_node != p_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RangeMap::DebugString() const {
  std::string ret;
  for (auto it = mappings_.begin(); it != mappings_.end(); ++it) {
    absl::StrAppend(&ret, EntryDebugString(it), "\n");
  }
  return ret;
}